

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3843.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementHexaANCF_3843::ComputeInternalForces(ChElementHexaANCF_3843 *this)

{
  ChVectorDynamic<> *in_RSI;
  
  ComputeInternalForces((ChElementHexaANCF_3843 *)&this[-1].field_0x15f8,in_RSI);
  return;
}

Assistant:

void ChElementHexaANCF_3843::ComputeInternalForces(ChVectorDynamic<>& Fi) {
    assert(Fi.size() == 3 * NSF);

    if (m_method == IntFrcMethod::ContInt) {
        if (m_damping_enabled) {  // If linear Kelvin-Voigt viscoelastic material model is enabled
            ComputeInternalForcesContIntDamping(Fi);
        } else {
            ComputeInternalForcesContIntNoDamping(Fi);
        }
    } else {
        ComputeInternalForcesContIntPreInt(Fi);
    }
}